

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUSet-inl.hh
# Opt level: O0

bool __thiscall
phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
change_size(LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
           size_t new_size)

{
  mapped_type *pmVar1;
  out_of_range *e;
  Item *i;
  size_t new_size_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  pmVar1 = ::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::LRUSet<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Item>_>_>
           ::at(&this->items,k);
  this->total_size = (new_size - pmVar1->size) + this->total_size;
  pmVar1->size = new_size;
  return true;
}

Assistant:

bool LRUSet<K>::change_size(const K& k, size_t new_size) {
  try {
    Item& i = this->items.at(k);
    this->total_size += new_size - i.size;
    i.size = new_size;
    return true;
  } catch (const std::out_of_range& e) {
    return false;
  }
}